

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Pixmap.cxx
# Opt level: O1

int __thiscall Fl_Pixmap::copy(Fl_Pixmap *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  int iVar1;
  char **ppcVar2;
  uint uVar3;
  uint uVar4;
  Fl_Pixmap *this_00;
  char **ppcVar5;
  size_t sVar6;
  char *pcVar7;
  ulong uVar8;
  char *pcVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  int iVar18;
  int ncolors;
  int chars_per_pixel;
  char new_info [255];
  uint local_174;
  ulong local_170;
  int local_164;
  char **local_160;
  ulong local_158;
  int local_150;
  int local_14c;
  ulong local_148;
  Fl_Pixmap *local_140;
  char local_138 [264];
  
  uVar8 = (ulong)src & 0xffffffff;
  iVar13 = (int)dst;
  iVar18 = (int)src;
  if (((this->super_Fl_Image).w_ == iVar13) && ((this->super_Fl_Image).h_ == iVar18)) {
    this_00 = (Fl_Pixmap *)operator_new(0x38);
    Fl_Pixmap(this_00,(this->super_Fl_Image).data_);
    copy_data(this_00);
  }
  else if (iVar18 < 1 || iVar13 < 1) {
    this_00 = (Fl_Pixmap *)0x0;
  }
  else {
    __isoc99_sscanf(*(this->super_Fl_Image).data_,"%*d%*d%d%d",&local_174,&local_164);
    local_158 = CONCAT44(local_158._4_4_,local_164 * iVar13 + 1);
    sprintf(local_138,"%d %d %d %d",(ulong)dst & 0xffffffff,(ulong)src & 0xffffffff);
    uVar4 = local_174;
    iVar1 = (this->super_Fl_Image).w_;
    local_150 = (this->super_Fl_Image).h_;
    lVar17 = (long)local_164;
    local_14c = local_150 / iVar18;
    local_150 = local_150 % iVar18;
    uVar10 = (ulong)local_174;
    uVar3 = iVar18 + 1 + local_174;
    if ((int)local_174 < 0) {
      uVar3 = iVar18 + 2;
    }
    local_170 = (ulong)(iVar1 / iVar13);
    ppcVar5 = (char **)operator_new__((ulong)uVar3 << 3);
    sVar6 = strlen(local_138);
    pcVar7 = (char *)operator_new__(sVar6 + 1);
    *ppcVar5 = pcVar7;
    strcpy(pcVar7,local_138);
    local_160 = ppcVar5;
    local_148 = uVar8;
    local_140 = this;
    if ((int)uVar4 < 0) {
      local_174 = -uVar4;
      pcVar7 = (char *)operator_new__((ulong)(uVar4 * -4));
      local_160[1] = pcVar7;
      memcpy(pcVar7,(this->super_Fl_Image).data_[1],(ulong)(uVar4 * -4));
      local_174 = 1;
      ppcVar5 = local_160 + 2;
    }
    else {
      ppcVar5 = ppcVar5 + 1;
      if (uVar10 != 0) {
        ppcVar2 = (this->super_Fl_Image).data_;
        lVar12 = 0;
        do {
          sVar6 = strlen(*(char **)((long)ppcVar2 + lVar12 + 8));
          pcVar7 = (char *)operator_new__(sVar6 + 1);
          *(char **)((long)ppcVar5 + lVar12) = pcVar7;
          strcpy(pcVar7,*(char **)((long)ppcVar2 + lVar12 + 8));
          lVar12 = lVar12 + 8;
        } while (uVar10 << 3 != lVar12);
        ppcVar5 = (char **)((long)ppcVar5 + lVar12);
        uVar8 = local_148;
      }
    }
    lVar17 = lVar17 * local_170;
    local_170 = (ulong)(int)local_158;
    uVar10 = uVar8 & 0xffffffff;
    uVar8 = uVar8 & 0xffffffff;
    iVar18 = 0;
    do {
      local_158 = uVar8;
      pcVar9 = (char *)operator_new__(local_170);
      *ppcVar5 = pcVar9;
      pcVar7 = (local_140->super_Fl_Image).data_[(long)iVar18 + (long)(int)local_174 + 1];
      uVar8 = (ulong)dst & 0xffffffff;
      uVar14 = (ulong)dst & 0xffffffff;
      do {
        if (0 < local_164) {
          lVar12 = 0;
          do {
            pcVar9[lVar12] = pcVar7[lVar12];
            lVar12 = lVar12 + 1;
          } while (lVar12 < local_164);
          pcVar9 = pcVar9 + lVar12;
        }
        iVar11 = (int)uVar8 - iVar1 % iVar13;
        iVar15 = local_164;
        if (0 < iVar11) {
          iVar15 = 0;
        }
        iVar16 = 0;
        if (iVar11 < 1) {
          iVar16 = iVar13;
        }
        pcVar7 = pcVar7 + iVar15 + lVar17;
        uVar8 = (ulong)(uint)(iVar11 + iVar16);
        iVar15 = (int)uVar14;
        uVar14 = (ulong)(iVar15 - 1);
      } while (1 < iVar15);
      *pcVar9 = '\0';
      iVar11 = (int)uVar10 - local_150;
      iVar15 = 0;
      if (iVar11 < 1) {
        iVar15 = (int)local_148;
      }
      iVar18 = iVar18 + local_14c + (uint)(iVar11 < 1);
      uVar10 = (ulong)(uint)(iVar11 + iVar15);
      uVar8 = (ulong)((int)local_158 - 1);
      ppcVar5 = ppcVar5 + 1;
    } while (1 < (int)local_158);
    this_00 = (Fl_Pixmap *)operator_new(0x38);
    Fl_Pixmap(this_00,local_160);
    this_00->alloc_data = 1;
  }
  return (int)this_00;
}

Assistant:

Fl_Image *Fl_Pixmap::copy(int W, int H) {
  Fl_Pixmap	*new_image;	// New pixmap

  // Optimize the simple copy where the width and height are the same...
  if (W == w() && H == h()) {
    // Make an exact copy of the image and return it...
    new_image = new Fl_Pixmap(data());
    new_image->copy_data();
    return new_image;
  }
  if (W <= 0 || H <= 0) return 0;

  // OK, need to resize the image data; allocate memory and
  char		**new_data,	// New array for image data
		**new_row,	// Pointer to row in image data
		*new_ptr,	// Pointer into new array
		new_info[255];	// New information line
  const char	*old_ptr;	// Pointer into old array
  int		i,		// Looping var
		c,		// Channel number
		sy,		// Source coordinate
		dx, dy,		// Destination coordinates
		xerr, yerr,	// X & Y errors
		xmod, ymod,	// X & Y moduli
		xstep, ystep;	// X & Y step increments
  int		ncolors,	// Number of colors in image
		chars_per_pixel,// Characters per color
		chars_per_line;	// Characters per line

  // Figure out how many colors there are, and how big they are...
  sscanf(data()[0],"%*d%*d%d%d", &ncolors, &chars_per_pixel);
  chars_per_line = chars_per_pixel * W + 1;

  sprintf(new_info, "%d %d %d %d", W, H, ncolors, chars_per_pixel);

  // Figure out Bresenham step/modulus values...
  xmod   = w() % W;
  xstep  = (w() / W) * chars_per_pixel;
  ymod   = h() % H;
  ystep  = h() / H;

  // Allocate memory for the new array...
  if (ncolors < 0) new_data = new char *[H + 2];
  else new_data = new char *[H + ncolors + 1];
  new_data[0] = new char[strlen(new_info) + 1];
  strcpy(new_data[0], new_info);

  // Copy colors...
  if (ncolors < 0) {
    // Copy FLTK colormap values...
    ncolors = -ncolors;
    new_row = new_data + 1;
    *new_row = new char[ncolors * 4];
    memcpy(*new_row, data()[1], ncolors * 4);
    ncolors = 1;
    new_row ++;
  } else {
    // Copy standard XPM colormap values...
    for (i = 0, new_row = new_data + 1; i < ncolors; i ++, new_row ++) {
      *new_row = new char[strlen(data()[i + 1]) + 1];
      strcpy(*new_row, data()[i + 1]);
    }
  }

  // Scale the image using a nearest-neighbor algorithm...
  for (dy = H, sy = 0, yerr = H; dy > 0; dy --, new_row ++) {
    *new_row = new char[chars_per_line];
    new_ptr  = *new_row;

    for (dx = W, xerr = W, old_ptr = data()[sy + ncolors + 1];
	 dx > 0;
	 dx --) {
      for (c = 0; c < chars_per_pixel; c ++) *new_ptr++ = old_ptr[c];

      old_ptr += xstep;
      xerr    -= xmod;

      if (xerr <= 0) {
	xerr    += W;
	old_ptr += chars_per_pixel;
      }
    }

    *new_ptr = '\0';
    sy       += ystep;
    yerr     -= ymod;
    if (yerr <= 0) {
      yerr += H;
      sy ++;
    }
  }

  new_image = new Fl_Pixmap((char*const*)new_data);
  new_image->alloc_data = 1;

  return new_image;
}